

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsRecruiter.cc
# Opt level: O0

void __thiscall
LongReadsRecruiter::simple_thread_reads(LongReadsRecruiter *this,int min_count,int min_bp)

{
  pair<int,_int> pVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppVar5;
  const_reference pvVar6;
  SequenceDistanceGraph *pSVar7;
  long in_RDI;
  int in_stack_00000028;
  int in_stack_0000002c;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> *in_stack_00000030;
  LongReadsRecruiter *in_stack_00000038;
  int64_t pend;
  int64_t pstart;
  pair<int,_int> nb;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2;
  value_type *matches;
  int64_t thread_offset;
  int rid;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffff28;
  SequenceDistanceGraph *in_stack_ffffffffffffff30;
  long *__args_2;
  reference in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int32_t iVar8;
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  *in_stack_ffffffffffffff50;
  SequenceDistanceGraph *this_00;
  int local_60;
  int iStack_5c;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_50;
  undefined1 local_48 [24];
  undefined1 *local_30;
  reference local_28;
  long local_20;
  int local_14;
  
  std::
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  ::clear((vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
           *)0x4dd2e3);
  std::
  vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
  ::size((vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
          *)(in_RDI + 0x18));
  std::
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  ::resize(in_stack_ffffffffffffff50,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_14 = 1;
  while( true ) {
    uVar3 = (ulong)local_14;
    sVar4 = std::
            vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
            ::size((vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                    *)(in_RDI + 0x18));
    if (sVar4 <= uVar3) break;
    local_20 = 0;
    local_28 = std::
               vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
               ::operator[]((vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                             *)(in_RDI + 0x18),(long)local_14);
    find_all_valid_blocks(in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000028);
    local_30 = local_48;
    local_50._M_current =
         (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                   (in_stack_ffffffffffffff28);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
              (in_stack_ffffffffffffff28);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          *)in_stack_ffffffffffffff30,
                         (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          *)in_stack_ffffffffffffff28);
      if (!bVar2) break;
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&local_50);
      pVar1 = *ppVar5;
      local_60 = pVar1.first;
      pvVar6 = std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::operator[]
                         (local_28,(long)local_60);
      iVar8 = pvVar6->read_position;
      pvVar6 = std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::operator[]
                         (local_28,(long)local_60);
      pSVar7 = (SequenceDistanceGraph *)((iVar8 - pvVar6->node_position) + local_20);
      this_00 = pSVar7;
      std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::operator[](local_28,(long)local_60);
      SequenceDistanceGraph::get_node_size
                (in_stack_ffffffffffffff30,(sgNodeID_t)in_stack_ffffffffffffff28);
      iStack_5c = pVar1.second;
      pvVar6 = std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::operator[]
                         (local_28,(long)iStack_5c);
      __args_2 = (long *)((long)&(pSVar7->super_DistanceGraph).sdg + (long)pvVar6->node_position);
      pvVar6 = std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::operator[]
                         (local_28,(long)iStack_5c);
      local_20 = (long)__args_2 - (long)pvVar6->read_position;
      in_stack_ffffffffffffff40 =
           std::
           vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
           ::operator[]((vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                         *)(in_RDI + 0x30),(long)local_14);
      std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::operator[](local_28,(long)local_60);
      std::vector<NodePosition,std::allocator<NodePosition>>::emplace_back<long_const&,long&,long&>
                ((vector<NodePosition,_std::allocator<NodePosition>_> *)this_00,
                 (long *)CONCAT44(iVar8,in_stack_ffffffffffffff48),(long *)in_stack_ffffffffffffff40
                 ,__args_2);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&local_50);
      in_stack_ffffffffffffff30 = pSVar7;
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_ffffffffffffff40);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void LongReadsRecruiter::simple_thread_reads(int min_count,int min_bp) {
    read_threads.clear();
    read_threads.resize(read_perfect_matches.size());
    for (auto rid=1;rid<read_perfect_matches.size();++rid){
        int64_t thread_offset=0;//offset between thread and read, computed on last block's position vs. its last match
        const auto & matches=read_perfect_matches[rid];
        for (auto nb:find_all_valid_blocks(matches,min_count,min_bp)) {
            int64_t pstart=matches[nb.first].read_position-matches[nb.first].node_position+thread_offset;
            int64_t pend=pstart+sdg.get_node_size(matches[nb.first].node);
            thread_offset=pstart+matches[nb.second].node_position-matches[nb.second].read_position;
            read_threads[rid].emplace_back(matches[nb.first].node, pstart, pend);
        }
    }
}